

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

void __thiscall w3Module::read_memory(w3Module *this,uint8_t **cursor)

{
  uint32_t uVar1;
  w3Limits wVar2;
  ulong local_60;
  size_t i;
  string local_40;
  ulong local_20;
  size_t size;
  uint8_t **cursor_local;
  w3Module *this_local;
  
  size = (size_t)cursor;
  cursor_local = (uint8_t **)this;
  printf("reading section5\n");
  uVar1 = read_varuint32(this,(uint8_t **)size);
  local_20 = (ulong)uVar1;
  if (1 < local_20) {
    StringFormat_abi_cxx11_(&local_40,"%lX",local_20);
    AssertFailedFormat("size <= 1",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  for (local_60 = 0; local_60 < local_20; local_60 = local_60 + 1) {
    wVar2 = read_limits(this,(uint8_t **)size);
    (this->memory_limits).min = (int)wVar2._0_8_;
    (this->memory_limits).max = (int)((ulong)wVar2._0_8_ >> 0x20);
    (this->memory_limits).hasMax = wVar2.hasMax;
  }
  printf("read section5 min:%X hasMax:%X max:%X\n",(ulong)(this->memory_limits).min,
         (ulong)((this->memory_limits).hasMax & 1),(ulong)(this->memory_limits).max);
  return;
}

Assistant:

void w3Module::read_memory (uint8_t** cursor)
{
    printf ("reading section5\n");
    const size_t size = read_varuint32 (cursor);
    AssertFormat (size <= 1, ("%" FORMAT_SIZE "X", size)); // FUTURE
    for (size_t i = 0; i < size; ++i)
        memory_limits = read_limits (cursor);
    printf ("read section5 min:%X hasMax:%X max:%X\n", memory_limits.min, memory_limits.hasMax, memory_limits.max);
}